

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionTest.cpp
# Opt level: O2

void __thiscall ActionTest::deleteTest(ActionTest *this)

{
  DynamicGraph *v;
  pointer pRVar1;
  Edge e;
  uint __line;
  iterator iVar2;
  ostream *poVar3;
  char *__assertion;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_68;
  Delete action;
  
  pRVar1 = (this->rel).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_start;
  v = &this->G;
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
            (&local_68,(boost *)0x0,1,(vertex_descriptor)v,in_R8);
  e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
       local_68.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
  e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
       local_68.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
  e.m_eproperty = local_68.first.m_eproperty;
  Delete::Delete(&action,&pRVar1->a_pred,e);
  Delete::undo(&action);
  pRVar1 = (this->rel).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&(pRVar1->a_pred)._M_t._M_impl.super__Rb_tree_header + 0x20) == 3) {
    boost::
    edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
              (&local_68,(boost *)0x0,1,(vertex_descriptor)v,in_R8);
    iVar2 = std::
            _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::find((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                    *)pRVar1,&local_68.first);
    pRVar1 = (this->rel).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((_Rb_tree_header *)iVar2._M_node == &(pRVar1->a_pred)._M_t._M_impl.super__Rb_tree_header) {
      __assertion = "rel[0].a_pred.find(edge(0, 1, G).first) != rel[0].a_pred.end()";
      __line = 0x30;
    }
    else {
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_68,(boost *)0x0,2,(vertex_descriptor)v,in_R8);
      iVar2 = std::
              _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ::find((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                      *)pRVar1,&local_68.first);
      pRVar1 = (this->rel).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((_Rb_tree_header *)iVar2._M_node == &(pRVar1->a_pred)._M_t._M_impl.super__Rb_tree_header)
      {
        __assertion = "rel[0].a_pred.find(edge(0, 2, G).first) != rel[0].a_pred.end()";
        __line = 0x31;
      }
      else {
        boost::
        edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                  (&local_68,(boost *)0x0,3,(vertex_descriptor)v,in_R8);
        iVar2 = std::
                _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                ::find((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                        *)pRVar1,&local_68.first);
        if (iVar2._M_node !=
            (_Base_ptr)
            ((long)&(((this->rel).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
                      super__Vector_impl_data._M_start)->a_pred)._M_t._M_impl + 8U)) {
          poVar3 = std::operator<<((ostream *)&std::cout,"[+] delete action test OK!");
          std::endl<char,std::char_traits<char>>(poVar3);
          return;
        }
        __assertion = "rel[0].a_pred.find(edge(0, 3, G).first) != rel[0].a_pred.end()";
        __line = 0x32;
      }
    }
  }
  else {
    __assertion = "rel[0].a_pred.size()==3";
    __line = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/ActionTest.cpp"
                ,__line,"void ActionTest::deleteTest()");
}

Assistant:

void ActionTest::deleteTest()
{
    Delete action(rel[0].a_pred, edge(0, 1, G).first);
    action.undo();

    assert(rel[0].a_pred.size()==3);
    assert(rel[0].a_pred.find(edge(0, 1, G).first) != rel[0].a_pred.end());
    assert(rel[0].a_pred.find(edge(0, 2, G).first) != rel[0].a_pred.end());
    assert(rel[0].a_pred.find(edge(0, 3, G).first) != rel[0].a_pred.end());

    std::cout << "[+] delete action test OK!" << std::endl;
}